

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Reals __thiscall Omega_h::invert_each(Omega_h *this,Reals *a)

{
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_d0;
  undefined1 local_c0 [8];
  type f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<double> out;
  Reals *a_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr = a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<double>::Write((Write<double> *)local_68,(LO)(local_10 >> 3),(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<double>::Write((Write<double> *)local_c0,(Write<double> *)local_68);
  Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,a);
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::invert_each(Omega_h::Read<double>)::__0>
            ((LO)(local_20 >> 3),(type *)local_c0,"invert_each");
  Write<double>::Write(&local_d0,(Write<signed_char> *)local_68);
  Read<double>::Read((Read<double> *)this,&local_d0);
  Write<double>::~Write(&local_d0);
  invert_each(Omega_h::Read<double>)::$_0::~__0((__0 *)local_c0);
  Write<double>::~Write((Write<double> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals invert_each(Reals a) {
  auto out = Write<Real>(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = 1.0 / a[i]; };
  parallel_for(a.size(), f, "invert_each");
  return out;
}